

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O1

BasicBlock * __thiscall
FlowGraph::InsertAirlockBlock(FlowGraph *this,FlowEdge *edge,bool afterForward)

{
  SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *this_00;
  RealCount *pRVar1;
  IRKind IVar2;
  OpCode OVar3;
  uint uVar4;
  BasicBlock *block;
  BasicBlock *pBVar5;
  Type pFVar6;
  LabelInstr *pLVar7;
  Instr *this_01;
  Func *func;
  LabelInstr *pLVar8;
  code *pcVar9;
  bool bVar10;
  BasicBlock *blockSucc;
  long lVar11;
  undefined4 *puVar12;
  Type *ppFVar13;
  BranchInstr *pBVar14;
  Type pSVar15;
  LabelInstr *newLabelInstr;
  FlowEdge *edge_00;
  BasicBlock *pBVar16;
  Func **ppFVar17;
  char *message;
  char *error;
  uint lineNumber;
  char *this_02;
  BranchInstr *local_38;
  
  blockSucc = BasicBlock::New(this);
  pBVar16 = edge->predBlock;
  block = edge->succBlock;
  pBVar5 = pBVar16->next;
  ppFVar17 = (Func **)&pBVar5->firstInstr;
  if (pBVar5 == (BasicBlock *)0x0) {
    ppFVar17 = &pBVar16->func;
  }
  lVar11 = 0x18;
  if (pBVar5 == (BasicBlock *)0x0) {
    lVar11 = 0xd0;
  }
  local_38 = *(BranchInstr **)((long)&(*ppFVar17)->m_alloc + lVar11);
  if ((local_38->super_Instr).m_kind != InstrKindBranch) {
    this_00 = &pBVar16->succList;
    pSVar15 = (pBVar16->succList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>.
              super_SListNodeBase<Memory::ArenaAllocator>.next;
    if (((SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *)pSVar15 == this_00) ||
       ((SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *)pSVar15->next != this_00)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar12 = 1;
      bVar10 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                          ,0x87e,"(successors->HasOne())",
                          "Failed to normalize weird block before airlock");
      if (!bVar10) goto LAB_0041edec;
      *puVar12 = 0;
    }
    ppFVar13 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Head
                         (&this_00->super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>);
    pFVar6 = *ppFVar13;
    if (pFVar6 != edge) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar12 = 1;
      bVar10 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                          ,0x880,"(onlyLink == edge)","Found duplicate of edge?");
      if (!bVar10) goto LAB_0041edec;
      *puVar12 = 0;
    }
    if (pFVar6->succBlock != block) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar12 = 1;
      bVar10 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                          ,0x881,"(onlyLink->GetSucc() == sinkBlock)","State inconsistent");
      if (!bVar10) goto LAB_0041edec;
      *puVar12 = 0;
    }
    pLVar7 = (LabelInstr *)pFVar6->succBlock->firstInstr;
    IVar2 = (pLVar7->super_Instr).m_kind;
    if ((IVar2 != InstrKindLabel) && (IVar2 != InstrKindProfiledLabel)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar12 = 1;
      bVar10 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                          ,0x7a,"(this->IsLabelInstr())","Bad call to AsLabelInstr()");
      if (!bVar10) goto LAB_0041edec;
      *puVar12 = 0;
    }
    pBVar14 = IR::BranchInstr::New(Br,pLVar7,(local_38->super_Instr).m_func);
    IR::Instr::InsertAfter(&local_38->super_Instr,&pBVar14->super_Instr);
    local_38 = (BranchInstr *)(local_38->super_Instr).m_next;
  }
  lVar11 = 0x18;
  pBVar5 = block->prev;
  ppFVar17 = (Func **)&pBVar5->next->firstInstr;
  if (pBVar5->next == (BasicBlock *)0x0) {
    lVar11 = 0xd0;
    ppFVar17 = &pBVar5->func;
  }
  this_01 = *(Instr **)((long)&(*ppFVar17)->m_alloc + lVar11);
  blockSucc->loop = block->loop;
  uVar4 = this->blockCount;
  this->blockCount = uVar4 + 1;
  blockSucc->number = uVar4;
  blockSucc->field_0x19 = blockSucc->field_0x19 | 2;
  blockSucc->prev = block->prev;
  block->prev = blockSucc;
  blockSucc->next = block;
  blockSucc->prev->next = blockSucc;
  BasicBlock::RemoveSucc(pBVar16,block,this,false,false);
  AddEdge(this,pBVar16,blockSucc);
  edge->predBlock = blockSucc;
  pSVar15 = (Type)new<Memory::ArenaAllocator>(0x10,&this->alloc->super_ArenaAllocator,0x366bee);
  pSVar15[1].next = (Type)edge;
  pSVar15->next =
       (blockSucc->succList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>.
       super_SListNodeBase<Memory::ArenaAllocator>.next;
  (blockSucc->succList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>.
  super_SListNodeBase<Memory::ArenaAllocator>.next = pSVar15;
  pRVar1 = &(blockSucc->succList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>.
            super_RealCount;
  pRVar1->count = pRVar1->count + 1;
  blockSucc->dataUseCount = 1;
  BasicBlock::DecrementDataUseCount(pBVar16);
  pLVar7 = (LabelInstr *)block->firstInstr;
  IVar2 = (pLVar7->super_Instr).m_kind;
  if ((IVar2 != InstrKindLabel) && (IVar2 != InstrKindProfiledLabel)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar12 = 1;
    bVar10 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                        ,0x7a,"(this->IsLabelInstr())","Bad call to AsLabelInstr()");
    if (!bVar10) goto LAB_0041edec;
    *puVar12 = 0;
  }
  func = (pLVar7->super_Instr).m_func;
  newLabelInstr = IR::LabelInstr::New(Label,func,false);
  IR::Instr::InsertAfter(this_01,&newLabelInstr->super_Instr);
  blockSucc->firstInstr = &newLabelInstr->super_Instr;
  if (newLabelInstr->m_block != (BasicBlock *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar12 = 1;
    bVar10 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                        ,0x2c8,"(this->m_block == nullptr || block == nullptr)",
                        "Overwriting existing block pointer");
    if (!bVar10) goto LAB_0041edec;
    *puVar12 = 0;
  }
  newLabelInstr->m_block = blockSucc;
  pBVar14 = IR::BranchInstr::New(Br,pLVar7,func);
  IR::Instr::SetByteCodeOffset(&pBVar14->super_Instr,(Instr *)pLVar7);
  IR::Instr::InsertAfter(&newLabelInstr->super_Instr,&pBVar14->super_Instr);
  this_02 = (char *)newLabelInstr;
  IR::Instr::SetByteCodeOffset(&newLabelInstr->super_Instr,(Instr *)pLVar7);
  if (afterForward) {
    newLabelInstr->m_region = pLVar7->m_region;
  }
  if ((local_38->super_Instr).m_kind != InstrKindBranch) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar12 = 1;
    this_02 = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl";
    bVar10 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                        ,0x5e,"(this->IsBranchInstr())","Bad call to AsBranchInstr()");
    if (!bVar10) goto LAB_0041edec;
    *puVar12 = 0;
  }
  pLVar8 = local_38->m_branchTarget;
  if (pLVar8 == (LabelInstr *)0x0) {
    if (local_38->m_isMultiBranch == false) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar12 = 1;
      error = "(m_isMultiBranch)";
      message = "m_isMultiBranch";
      lineNumber = 0x20e;
      goto LAB_0041ec19;
    }
  }
  else if (local_38->m_isMultiBranch != false) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar12 = 1;
    error = "(!m_isMultiBranch)";
    message = "!m_isMultiBranch";
    lineNumber = 0x209;
LAB_0041ec19:
    this_02 = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl";
    bVar10 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                        ,lineNumber,error,message);
    if (!bVar10) goto LAB_0041edec;
    *puVar12 = 0;
  }
  if (pLVar8 == (LabelInstr *)0x0) {
    this_02 = (char *)IR::BranchInstr::AsMultiBrInstr(local_38);
    bVar10 = IR::MultiBranchInstr::ReplaceTarget((MultiBranchInstr *)this_02,pLVar7,newLabelInstr);
    if (!bVar10) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar12 = 1;
      this_02 = 
      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
      ;
      bVar10 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                          ,0x8cd,"(replaced)","replaced");
      if (!bVar10) {
LAB_0041edec:
        pcVar9 = (code *)invalidInstructionException();
        (*pcVar9)();
      }
      *puVar12 = 0;
    }
  }
  else if (local_38->m_branchTarget == pLVar7) {
    if (local_38->m_isMultiBranch == true) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar12 = 1;
      bVar10 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                          ,0x1d3,"(!this->m_isMultiBranch)","!this->m_isMultiBranch");
      if (!bVar10) goto LAB_0041edec;
      *puVar12 = 0;
    }
    if (local_38->m_branchTarget != (LabelInstr *)0x0) {
      IR::LabelInstr::RemoveLabelRef(local_38->m_branchTarget,local_38);
    }
    this_02 = (char *)newLabelInstr;
    IR::LabelInstr::AddLabelRef(newLabelInstr,local_38);
    local_38->m_branchTarget = newLabelInstr;
  }
  if (this_01->m_kind == InstrKindBranch) {
    if (this_01->m_kind == InstrKindBranch) {
      OVar3 = this_01->m_opcode;
      if (OVar3 < ADD) {
        bVar10 = OVar3 == MultiBr || OVar3 == Br;
      }
      else {
        bVar10 = LowererMD::IsUnconditionalBranch(this_01);
      }
      if (bVar10 != false) goto LAB_0041edc5;
    }
    this_02 = (char *)(ulong)this_01->m_opcode;
    bVar10 = OpCodeAttr::HasFallThrough(this_01->m_opcode);
    if (!bVar10) goto LAB_0041edc5;
  }
  if (((pBVar5->field_0x18 & 1) == 0) &&
     (edge_00 = FindEdge((FlowGraph *)this_02,pBVar5,block), edge_00 != (FlowEdge *)0x0)) {
    pBVar16 = InsertCompensationCodeForBlockMove(this,edge_00,true,true,afterForward);
    pBVar16->dataUseCount = pBVar16->dataUseCount + 1;
    pBVar16->field_0x18 = pBVar16->field_0x18 | 0x40;
  }
LAB_0041edc5:
  Dump(this,true,L"\n After insertion of airlock block \n");
  return blockSucc;
}

Assistant:

BasicBlock *
FlowGraph::InsertAirlockBlock(FlowEdge * edge, bool afterForward /*= false*/)
{
    BasicBlock * airlockBlock = BasicBlock::New(this);
    BasicBlock * sourceBlock = edge->GetPred();
    BasicBlock * sinkBlock = edge->GetSucc();

    IR::Instr * sourceLastInstr = sourceBlock->GetLastInstr();

    //
    // Normalize block
    //
    if(!sourceLastInstr->IsBranchInstr())
    {
        // There are some cases where the last instruction of a block can be not a branch;
        // for example, if it was previously a conditional branch that was impossible to take.
        // In these situations, we can insert an unconditional branch to fallthrough for that
        // block, to renormalize it.
        SListBaseCounted<FlowEdge*>* successors = sourceBlock->GetSuccList();
        // Only handling the case for one arc left at the moment; other cases are likely bugs.
        AssertOrFailFastMsg(successors->HasOne(), "Failed to normalize weird block before airlock");
        FlowEdge* onlyLink = successors->Head();
        AssertOrFailFastMsg(onlyLink == edge, "Found duplicate of edge?");
        AssertOrFailFastMsg(onlyLink->GetSucc() == sinkBlock, "State inconsistent");
        sourceLastInstr->InsertAfter(IR::BranchInstr::New(Js::OpCode::Br, onlyLink->GetSucc()->GetFirstInstr()->AsLabelInstr(), sourceLastInstr->m_func));
        sourceLastInstr = sourceLastInstr->m_next;
    }

    BasicBlock * sinkPrevBlock = sinkBlock->prev;
    IR::Instr *  sinkPrevBlockLastInstr = sinkPrevBlock->GetLastInstr();

    airlockBlock->loop = sinkBlock->loop;
    airlockBlock->SetBlockNum(this->blockCount++);
#ifdef DBG
    airlockBlock->isAirLockBlock = true;
#endif

    //
    // Fixup block linkage
    //

    // airlock block is inserted right before sourceBlock
    airlockBlock->prev = sinkBlock->prev;
    sinkBlock->prev = airlockBlock;

    airlockBlock->next = sinkBlock;
    airlockBlock->prev->next = airlockBlock;

    //
    // Fixup flow edges
    //

    sourceBlock->RemoveSucc(sinkBlock, this, false);

    // Add sourceBlock -> airlockBlock
    this->AddEdge(sourceBlock, airlockBlock);

    // Add airlockBlock -> sinkBlock
    edge->SetPred(airlockBlock);
    airlockBlock->AddSucc(edge, this);

    // Fixup data use count
    airlockBlock->SetDataUseCount(1);
    sourceBlock->DecrementDataUseCount();

    //
    // Fixup IR
    //

    // Maintain the instruction region for inlining
    IR::LabelInstr *sinkLabel = sinkBlock->GetFirstInstr()->AsLabelInstr();
    Func * sinkLabelFunc = sinkLabel->m_func;

    IR::LabelInstr *airlockLabel = IR::LabelInstr::New(Js::OpCode::Label, sinkLabelFunc);

    sinkPrevBlockLastInstr->InsertAfter(airlockLabel);

    airlockBlock->SetFirstInstr(airlockLabel);
    airlockLabel->SetBasicBlock(airlockBlock);

    // Add br to sinkBlock from airlock block
    IR::BranchInstr *airlockBr = IR::BranchInstr::New(Js::OpCode::Br, sinkLabel, sinkLabelFunc);
    airlockBr->SetByteCodeOffset(sinkLabel);
    airlockLabel->InsertAfter(airlockBr);
    airlockBlock->SetLastInstr(airlockBr);

    airlockLabel->SetByteCodeOffset(sinkLabel);

    // If we have regions in play, we should update them on the airlock block appropriately
    if (afterForward)
    {
        airlockLabel->SetRegion(sinkLabel->GetRegion());
    }

    // Fixup flow out of sourceBlock
    IR::BranchInstr *sourceBr = sourceLastInstr->AsBranchInstr();
    if (sourceBr->IsMultiBranch())
    {
        const bool replaced = sourceBr->AsMultiBrInstr()->ReplaceTarget(sinkLabel, airlockLabel);
        Assert(replaced);
    }
    else if (sourceBr->GetTarget() == sinkLabel)
    {
        sourceBr->SetTarget(airlockLabel);
    }

    if (!sinkPrevBlockLastInstr->IsBranchInstr() || sinkPrevBlockLastInstr->AsBranchInstr()->HasFallThrough())
    {
        if (!sinkPrevBlock->isDeleted)
        {
            FlowEdge *dstEdge = this->FindEdge(sinkPrevBlock, sinkBlock);
            if (dstEdge) // Possibility that sourceblock may be same as sinkPrevBlock
            {
                BasicBlock* compensationBlock = this->InsertCompensationCodeForBlockMove(dstEdge, true /*insert comp block to loop list*/, true, afterForward);
                compensationBlock->IncrementDataUseCount();
                // We need to skip airlock compensation block in globopt as its inserted while globopt is iteration over the blocks.
                compensationBlock->isAirLockCompensationBlock = true;
            }
        }
    }

#if DBG_DUMP
    this->Dump(true, _u("\n After insertion of airlock block \n"));
#endif

    return airlockBlock;
}